

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.h
# Opt level: O2

Int64Range * __thiscall CoreML::Specification::Int64Parameter::mutable_range(Int64Parameter *this)

{
  Int64Range *this_00;
  
  if (this->_oneof_case_[0] == 10) {
    this_00 = (this->AllowedValues_).range_;
  }
  else {
    clear_AllowedValues(this);
    this->_oneof_case_[0] = 10;
    this_00 = (Int64Range *)operator_new(0x28);
    Int64Range::Int64Range(this_00);
    (this->AllowedValues_).range_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::Int64Range* Int64Parameter::mutable_range() {
  if (!has_range()) {
    clear_AllowedValues();
    set_has_range();
    AllowedValues_.range_ = new ::CoreML::Specification::Int64Range;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Int64Parameter.range)
  return AllowedValues_.range_;
}